

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O3

void __thiscall bloaty::RollupOutput::~RollupOutput(RollupOutput *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->disassembly_)._M_dataplus._M_p;
  paVar1 = &(this->disassembly_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::vector<bloaty::RollupRow,_std::allocator<bloaty::RollupRow>_>::~vector
            (&(this->toplevel_row_).sorted_children);
  pcVar2 = (this->toplevel_row_).name._M_dataplus._M_p;
  paVar1 = &(this->toplevel_row_).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->source_names_);
  return;
}

Assistant:

RollupOutput() : toplevel_row_("TOTAL") {}